

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O3

void __thiscall
QMessageBoxPrivate::helperPrepareShow(QMessageBoxPrivate *this,QPlatformDialogHelper *param_1)

{
  QWidget *this_00;
  QMessageDialogOptions *pQVar1;
  QLabel *this_01;
  long lVar2;
  QPixmap *pQVar3;
  long *plVar4;
  byte bVar5;
  QFlagsStorage<QDialogButtonBox::StandardButton> QVar6;
  ButtonRole BVar7;
  QPushButton *pQVar8;
  iterator iVar9;
  iterator iVar10;
  int button;
  StandardButton which;
  long in_FS_OFFSET;
  QStringView QVar11;
  QStringView QVar12;
  QArrayData *local_70;
  storage_type_conflict *local_68;
  long local_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  pQVar1 = (this->options).value.ptr;
  QWidget::windowTitle(&local_58,this_00);
  QMessageDialogOptions::setWindowTitle((QString *)pQVar1);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar1 = (this->options).value.ptr;
  QLabel::text(&local_58,*(QLabel **)(*(long *)&this_00->field_0x8 + 0x2e0));
  QMessageDialogOptions::setText((QString *)pQVar1);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar1 = (this->options).value.ptr;
  this_01 = *(QLabel **)(*(long *)&this_00->field_0x8 + 0x358);
  if (this_01 == (QLabel *)0x0) {
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (storage_type_conflict *)0x0;
    local_58.d.size = 0;
  }
  else {
    QLabel::text(&local_58,this_01);
  }
  QMessageDialogOptions::setInformativeText((QString *)pQVar1);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar1 = (this->options).value.ptr;
  lVar2 = *(long *)(*(long *)&this_00->field_0x8 + 0x340);
  if (lVar2 == 0) {
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (storage_type_conflict *)0x0;
    local_58.d.size = 0;
  }
  else {
    QTextEdit::toPlainText(&local_58,*(QTextEdit **)(lVar2 + 0x30));
  }
  QMessageDialogOptions::setDetailedText((QString *)pQVar1);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  QMessageDialogOptions::setStandardIcon((StandardIcon)(this->options).value.ptr);
  pQVar3 = (QPixmap *)(this->options).value.ptr;
  QLabel::pixmap((QLabel *)&local_58);
  QMessageDialogOptions::setIconPixmap(pQVar3);
  QPixmap::~QPixmap((QPixmap *)&local_58);
  QMessageDialogOptions::clearCustomButtons();
  QVar6.i = (Int)QDialogButtonBox::standardButtons
                           (*(QDialogButtonBox **)(*(long *)&this_00->field_0x8 + 0x2f8));
  which = FirstButton;
  do {
    pQVar8 = QDialogButtonBox::button((QDialogButtonBox *)this->buttonBox,which);
    plVar4 = QGuiApplicationPrivate::platform_theme;
    if (pQVar8 != (QPushButton *)0x0) {
      if (QGuiApplicationPrivate::platform_theme != (long *)0x0) {
        QAbstractButton::text(&local_58,&pQVar8->super_QAbstractButton);
        (**(code **)(*plVar4 + 0x88))(&local_70,plVar4,which);
        bVar5 = 1;
        if (local_58.d.size == local_60) {
          QVar11.m_data = local_58.d.ptr;
          QVar11.m_size = local_58.d.size;
          QVar12.m_data = local_68;
          QVar12.m_size = local_58.d.size;
          bVar5 = QtPrivate::equalStrings(QVar11,QVar12);
          bVar5 = bVar5 ^ 1;
        }
        if (local_70 != (QArrayData *)0x0) {
          LOCK();
          (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_70,2,0x10);
          }
        }
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (bVar5 != 0) {
          BVar7 = QDialogButtonBox::buttonRole
                            ((QDialogButtonBox *)this->buttonBox,&pQVar8->super_QAbstractButton);
          pQVar1 = (this->options).value.ptr;
          QAbstractButton::text(&local_58,&pQVar8->super_QAbstractButton);
          QMessageDialogOptions::addButton
                    ((QString *)pQVar1,(ButtonRole)(QPixmap *)&local_58,(void *)(ulong)(uint)BVar7,
                     (int)pQVar8);
          if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
            }
          }
          QVar6.i = QVar6.i & ~which;
        }
      }
      if (pQVar8 == this->defaultButton) {
        QMessageDialogOptions::setDefaultButton((int)(this->options).value.ptr);
      }
      else if (pQVar8 == (QPushButton *)this->detectedEscapeButton) {
        QMessageDialogOptions::setEscapeButton((int)(this->options).value.ptr);
      }
    }
    which = which * 2;
  } while ((int)which < 0x8000001);
  QMessageDialogOptions::setStandardButtons((this->options).value.ptr,QVar6.i);
  iVar9 = QList<QAbstractButton_*>::begin(&this->customButtonList);
  iVar10 = QList<QAbstractButton_*>::end(&this->customButtonList);
  for (; iVar9.i != iVar10.i; iVar9.i = iVar9.i + 1) {
    pQVar8 = (QPushButton *)*iVar9.i;
    if (pQVar8 != &this->detailsButton->super_QPushButton) {
      BVar7 = QDialogButtonBox::buttonRole
                        ((QDialogButtonBox *)this->buttonBox,(QAbstractButton *)pQVar8);
      pQVar1 = (this->options).value.ptr;
      QAbstractButton::text(&local_58,(QAbstractButton *)pQVar8);
      QMessageDialogOptions::addButton
                ((QString *)pQVar1,(ButtonRole)&local_58,(void *)(ulong)(uint)BVar7,(int)pQVar8);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (pQVar8 == this->defaultButton) {
        QMessageDialogOptions::setDefaultButton((int)(this->options).value.ptr);
      }
      else if (pQVar8 == (QPushButton *)this->detectedEscapeButton) {
        QMessageDialogOptions::setEscapeButton((int)(this->options).value.ptr);
      }
    }
  }
  if (this->checkbox != (QCheckBox *)0x0) {
    pQVar1 = (this->options).value.ptr;
    QAbstractButton::text(&local_58,&this->checkbox->super_QAbstractButton);
    QCheckBox::checkState(this->checkbox);
    QMessageDialogOptions::setCheckBox((QString *)pQVar1,(CheckState)&local_58);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMessageBoxPrivate::helperPrepareShow(QPlatformDialogHelper *)
{
    Q_Q(QMessageBox);
    options->setWindowTitle(q->windowTitle());
    options->setText(q->text());
    options->setInformativeText(q->informativeText());
#if QT_CONFIG(textedit)
    options->setDetailedText(q->detailedText());
#endif
    options->setStandardIcon(helperIcon(q->icon()));
    options->setIconPixmap(q->iconPixmap());

    // Clear up front, since we might have prepared earlier
    options->clearCustomButtons();

    // Add standard buttons and resolve default/escape button
    auto standardButtons = helperStandardButtons(q);
    for (int button = QDialogButtonBox::StandardButton::FirstButton;
             button <= QDialogButtonBox::StandardButton::LastButton; button <<= 1) {
        auto *standardButton = buttonBox->button(QDialogButtonBox::StandardButton(button));
        if (!standardButton)
            continue;

        if (auto *platformTheme = QGuiApplicationPrivate::platformTheme()) {
            if (standardButton->text() != platformTheme->standardButtonText(button)) {
                // The standard button has been customized, so add it as
                // a custom button instead.
                const auto buttonRole = buttonBox->buttonRole(standardButton);
                options->addButton(standardButton->text(),
                    static_cast<QPlatformDialogHelper::ButtonRole>(buttonRole),
                    standardButton, button);
                standardButtons &= ~QPlatformDialogHelper::StandardButton(button);
            }
        }

        if (standardButton == defaultButton)
            options->setDefaultButton(button);
        else if (standardButton == detectedEscapeButton)
            options->setEscapeButton(button);
    }
    options->setStandardButtons(standardButtons);

    // Add custom buttons and resolve default/escape button
    for (auto *customButton : customButtonList) {
        // Unless it's the details button, since we don't do any
        // plumbing for the button's action in that case.
        if (customButton == detailsButton)
            continue;

        const auto buttonRole = buttonBox->buttonRole(customButton);
        const int buttonId = options->addButton(customButton->text(),
            static_cast<QPlatformDialogHelper::ButtonRole>(buttonRole),
            customButton);

        if (customButton == defaultButton)
            options->setDefaultButton(buttonId);
        else if (customButton == detectedEscapeButton)
            options->setEscapeButton(buttonId);
    }

    if (checkbox)
        options->setCheckBox(checkbox->text(), checkbox->checkState());
}